

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int str_format(lua_State *L)

{
  char cVar1;
  ushort *puVar2;
  StkId pTVar3;
  int iVar4;
  byte *pbVar5;
  void *pvVar6;
  ushort **ppuVar7;
  size_t sVar8;
  char *pcVar9;
  TValue *pTVar10;
  ulong uVar11;
  byte *pbVar12;
  char *pcVar13;
  size_t l_00;
  byte bVar14;
  byte *pbVar15;
  byte *pbVar16;
  int idx;
  bool bVar17;
  lua_Number lVar18;
  char form [18];
  size_t l;
  size_t sfl;
  char buff [512];
  undefined4 local_227c;
  char local_2278 [24];
  ulong local_2260;
  ulong local_2258;
  size_t local_2250;
  char local_2248 [512];
  luaL_Buffer local_2048;
  
  local_2258 = (long)L->top - (long)L->base;
  idx = 1;
  pbVar5 = (byte *)luaL_checklstring(L,1,&local_2250);
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2048.L = L;
  if (0 < (long)local_2250) {
    local_2258 = local_2258 >> 4;
    pbVar15 = pbVar5 + local_2250;
    do {
      if (*pbVar5 != 0x25) {
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar4 = emptybuffer(&local_2048), iVar4 != 0)) {
          adjuststack(&local_2048);
        }
        bVar14 = *pbVar5;
        pbVar5 = pbVar5 + 1;
LAB_0011271d:
        *local_2048.p = bVar14;
        local_2048.p = local_2048.p + 1;
        goto LAB_0011294a;
      }
      bVar14 = pbVar5[1];
      if (bVar14 == 0x25) {
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar4 = emptybuffer(&local_2048), iVar4 != 0)) {
          adjuststack(&local_2048);
        }
        bVar14 = pbVar5[1];
        pbVar5 = pbVar5 + 2;
        goto LAB_0011271d;
      }
      local_227c = idx + 1;
      if ((int)local_2258 <= idx) {
        luaL_argerror(L,local_227c,"no value");
      }
      pbVar5 = pbVar5 + 1;
      pbVar16 = pbVar5;
      if (bVar14 == 0) {
        uVar11 = 0;
      }
      else {
        do {
          pvVar6 = memchr("-+ #0",(int)(char)bVar14,6);
          if (pvVar6 == (void *)0x0) goto LAB_00112785;
          bVar14 = pbVar16[1];
          pbVar16 = pbVar16 + 1;
        } while (bVar14 != 0);
        bVar14 = 0;
LAB_00112785:
        uVar11 = (ulong)bVar14;
      }
      if (5 < (ulong)((long)pbVar16 - (long)pbVar5)) {
        pcVar13 = "invalid format (repeated flags)";
LAB_00112bba:
        luaL_error(L,pcVar13);
      }
      ppuVar7 = __ctype_b_loc();
      puVar2 = *ppuVar7;
      uVar11 = (ulong)(puVar2[uVar11] >> 0xb & 1);
      pbVar16 = pbVar16 + ((puVar2[pbVar16[uVar11]] >> 0xb & 1) != 0) + uVar11;
      bVar14 = *pbVar16;
      if (bVar14 == 0x2e) {
        bVar17 = (*(byte *)((long)puVar2 + (ulong)pbVar16[1] * 2 + 1) & 8) == 0;
        pbVar12 = pbVar16 + 2;
        if (bVar17) {
          pbVar12 = pbVar16 + 1;
        }
        pbVar16 = pbVar12 + ((puVar2[pbVar16[2 - (ulong)bVar17]] >> 0xb & 1) != 0);
        bVar14 = *pbVar16;
      }
      if ((*(byte *)((long)puVar2 + (ulong)bVar14 * 2 + 1) & 8) != 0) {
        pcVar13 = "invalid format (width or precision too long)";
        goto LAB_00112bba;
      }
      local_2278[0] = '%';
      strncpy(local_2278 + 1,(char *)pbVar5,(size_t)(pbVar16 + (1 - (long)pbVar5)));
      idx = local_227c;
      pbVar16[(long)(local_2278 + (2 - (long)pbVar5))] = 0;
      bVar14 = *pbVar16;
      pbVar5 = pbVar16 + 1;
      if (bVar14 < 99) {
        if ((bVar14 != 0x45) && (bVar14 != 0x47)) {
          if (bVar14 != 0x58) goto switchD_0011286b_caseD_68;
          goto switchD_0011286b_caseD_6f;
        }
switchD_0011286b_caseD_65:
        luaL_checknumber(L,local_227c);
        sprintf(local_2248,local_2278);
        goto LAB_00112934;
      }
      switch(bVar14) {
      case 99:
        lVar18 = luaL_checknumber(L,local_227c);
        sprintf(local_2248,local_2278,(ulong)(uint)(int)lVar18);
        goto LAB_00112934;
      case 100:
      case 0x69:
        sVar8 = strlen(local_2278);
        cVar1 = local_2278[sVar8 - 1];
        (local_2278 + (sVar8 - 1))[0] = 'l';
        (local_2278 + (sVar8 - 1))[1] = '\0';
        local_2278[sVar8] = cVar1;
        local_2278[sVar8 + 1] = '\0';
        lVar18 = luaL_checknumber(L,idx);
        pcVar13 = (char *)(long)lVar18;
        goto LAB_00112910;
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_0011286b_caseD_65;
      default:
switchD_0011286b_caseD_68:
        luaL_error(L,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)(char)bVar14);
      case 0x6f:
      case 0x75:
      case 0x78:
switchD_0011286b_caseD_6f:
        sVar8 = strlen(local_2278);
        cVar1 = local_2278[sVar8 - 1];
        (local_2278 + (sVar8 - 1))[0] = 'l';
        (local_2278 + (sVar8 - 1))[1] = '\0';
        local_2278[sVar8] = cVar1;
        local_2278[sVar8 + 1] = '\0';
        lVar18 = luaL_checknumber(L,idx);
        pcVar13 = (char *)((long)(lVar18 - 9.223372036854776e+18) & (long)lVar18 >> 0x3f |
                          (long)lVar18);
LAB_00112910:
        sprintf(local_2248,local_2278,pcVar13);
LAB_00112934:
        sVar8 = strlen(local_2248);
        luaL_addlstring(&local_2048,local_2248,sVar8);
        break;
      case 0x71:
        pbVar16 = (byte *)luaL_checklstring(L,local_227c,&local_2260);
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar4 = emptybuffer(&local_2048), iVar4 != 0)) {
          adjuststack(&local_2048);
        }
        *local_2048.p = 0x22;
        local_2048.p = local_2048.p + 1;
        while (bVar17 = local_2260 != 0, local_2260 = local_2260 - 1, bVar17) {
          bVar14 = *pbVar16;
          if (bVar14 < 0xd) {
            if (bVar14 == 0) {
              l_00 = 4;
              pcVar13 = "\\000";
              goto LAB_00112a7f;
            }
            if (bVar14 == 10) goto LAB_001129e2;
LAB_00112a1f:
            if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
               (iVar4 = emptybuffer(&local_2048), iVar4 != 0)) {
              adjuststack(&local_2048);
            }
            *local_2048.p = *pbVar16;
            local_2048.p = local_2048.p + 1;
          }
          else {
            if (bVar14 != 0xd) {
              if ((bVar14 == 0x5c) || (bVar14 == 0x22)) {
LAB_001129e2:
                if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                   (iVar4 = emptybuffer(&local_2048), iVar4 != 0)) {
                  adjuststack(&local_2048);
                }
                *local_2048.p = 0x5c;
                local_2048.p = local_2048.p + 1;
              }
              goto LAB_00112a1f;
            }
            l_00 = 2;
            pcVar13 = "\\r";
LAB_00112a7f:
            luaL_addlstring(&local_2048,pcVar13,l_00);
          }
          pbVar16 = pbVar16 + 1;
        }
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar4 = emptybuffer(&local_2048), iVar4 != 0)) {
          adjuststack(&local_2048);
        }
        *local_2048.p = 0x22;
        local_2048.p = local_2048.p + 1;
        break;
      case 0x73:
        pcVar13 = luaL_checklstring(L,local_227c,&local_2260);
        pcVar9 = strchr(local_2278,0x2e);
        if ((pcVar9 != (char *)0x0) || (local_2260 < 100)) goto LAB_00112910;
        pTVar10 = index2adr(L,idx);
        pTVar3 = L->top;
        pTVar3->value = pTVar10->value;
        pTVar3->tt = pTVar10->tt;
        L->top = L->top + 1;
        luaL_addvalue(&local_2048);
      }
LAB_0011294a:
    } while (pbVar5 < pbVar15);
  }
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  return 1;
}

Assistant:

static int str_format(lua_State*L){
int top=lua_gettop(L);
int arg=1;
size_t sfl;
const char*strfrmt=luaL_checklstring(L,arg,&sfl);
const char*strfrmt_end=strfrmt+sfl;
luaL_Buffer b;
luaL_buffinit(L,&b);
while(strfrmt<strfrmt_end){
if(*strfrmt!='%')
luaL_addchar(&b,*strfrmt++);
else if(*++strfrmt=='%')
luaL_addchar(&b,*strfrmt++);
else{
char form[(sizeof("-+ #0")+sizeof("l")+10)];
char buff[512];
if(++arg>top)
luaL_argerror(L,arg,"no value");
strfrmt=scanformat(L,strfrmt,form);
switch(*strfrmt++){
case'c':{
sprintf(buff,form,(int)luaL_checknumber(L,arg));
break;
}
case'd':case'i':{
addintlen(form);
sprintf(buff,form,(long)luaL_checknumber(L,arg));
break;
}
case'o':case'u':case'x':case'X':{
addintlen(form);
sprintf(buff,form,(unsigned long)luaL_checknumber(L,arg));
break;
}
case'e':case'E':case'f':
case'g':case'G':{
sprintf(buff,form,(double)luaL_checknumber(L,arg));
break;
}
case'q':{
addquoted(L,&b,arg);
continue;
}
case's':{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
if(!strchr(form,'.')&&l>=100){
lua_pushvalue(L,arg);
luaL_addvalue(&b);
continue;
}
else{
sprintf(buff,form,s);
break;
}
}
default:{
return luaL_error(L,"invalid option "LUA_QL("%%%c")" to "
LUA_QL("format"),*(strfrmt-1));
}
}
luaL_addlstring(&b,buff,strlen(buff));
}
}
luaL_pushresult(&b);
return 1;
}